

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDLoad(TranslateToFuzzReader *this)

{
  Name memory;
  int8_t iVar1;
  SIMDLoadOp op_00;
  Index IVar2;
  int iVar3;
  Expression *ptr_00;
  reference this_00;
  pointer pMVar4;
  SIMDLoad *pSVar5;
  Expression *ptr;
  Address align;
  Address offset;
  SIMDLoadOp op;
  TranslateToFuzzReader *this_local;
  
  op_00 = pick<wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp>
                    (this,Load8SplatVec128,Load16SplatVec128,Load32SplatVec128,Load64SplatVec128,
                     Load8x8SVec128,Load8x8UVec128,Load16x4SVec128,Load16x4UVec128,Load32x2SVec128,
                     Load32x2UVec128);
  iVar1 = get(this);
  IVar2 = logify(this,(int)iVar1);
  Address::Address(&align,(ulong)IVar2);
  Address::Address((Address *)&ptr);
  switch(op_00) {
  case Load8SplatVec128:
    Address::operator=((Address *)&ptr,1);
    break;
  case Load16SplatVec128:
    iVar3 = pick<int,int>(this,1,2);
    Address::operator=((Address *)&ptr,(long)iVar3);
    break;
  case Load32SplatVec128:
    iVar3 = pick<int,int,int>(this,1,2,4);
    Address::operator=((Address *)&ptr,(long)iVar3);
    break;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
    iVar3 = pick<int,int,int,int>(this,1,2,4,8);
    Address::operator=((Address *)&ptr,(long)iVar3);
    break;
  case Load32ZeroVec128:
  case Load64ZeroVec128:
    ::wasm::handle_unreachable
              ("Unexpected SIMD loads",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xc2d);
  }
  ptr_00 = makePointer(this);
  this_00 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::operator[](&this->wasm->memories,0);
  pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
  memory.super_IString.str._M_str._4_4_ =
       (int)((ulong)(pMVar4->super_Importable).super_Named.name.super_IString.str._M_str >> 0x20);
  memory.super_IString.str._0_12_ =
       *(undefined1 (*) [12])&(pMVar4->super_Importable).super_Named.name.super_IString.str;
  pSVar5 = Builder::makeSIMDLoad(&this->builder,op_00,align,(Address)ptr,ptr_00,memory);
  return (Expression *)pSVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDLoad() {
  // TODO: add Load{32,64}Zero if merged to proposal
  SIMDLoadOp op = pick(Load8SplatVec128,
                       Load16SplatVec128,
                       Load32SplatVec128,
                       Load64SplatVec128,
                       Load8x8SVec128,
                       Load8x8UVec128,
                       Load16x4SVec128,
                       Load16x4UVec128,
                       Load32x2SVec128,
                       Load32x2UVec128);
  Address offset = logify(get());
  Address align;
  switch (op) {
    case Load8SplatVec128:
      align = 1;
      break;
    case Load16SplatVec128:
      align = pick(1, 2);
      break;
    case Load32SplatVec128:
      align = pick(1, 2, 4);
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
      align = pick(1, 2, 4, 8);
      break;
    case Load32ZeroVec128:
    case Load64ZeroVec128:
      WASM_UNREACHABLE("Unexpected SIMD loads");
  }
  Expression* ptr = makePointer();
  return builder.makeSIMDLoad(op, offset, align, ptr, wasm.memories[0]->name);
}